

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Interval a;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Interval i;
  uint uVar8;
  uint uVar9;
  Interval c_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Interval IVar15;
  Interval IVar16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar21 [16];
  undefined1 auVar34 [64];
  undefined1 auVar22 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  Point3fi oi;
  Vector3fi di;
  Interval b;
  Interval f;
  Interval c;
  undefined1 local_f8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  Point3fi local_c8;
  Point3fi local_a8;
  Interval local_90;
  undefined1 local_88 [16];
  Vector3fi local_78;
  Interval local_60;
  Interval local_58;
  Interval local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  fVar51 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar19._4_4_ = fVar51;
  auVar19._0_4_ = fVar51;
  auVar19._8_4_ = fVar51;
  auVar19._12_4_ = fVar51;
  fVar51 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar10._4_4_ = fVar51;
  auVar10._0_4_ = fVar51;
  auVar10._8_4_ = fVar51;
  auVar10._12_4_ = fVar51;
  fVar51 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar53._4_4_ = fVar51;
  auVar53._0_4_ = fVar51;
  auVar53._8_4_ = fVar51;
  auVar53._12_4_ = fVar51;
  local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar19,auVar10);
  local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar53);
  Transform::operator()(&local_c8,this->objectFromRender,&local_a8);
  fVar51 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar11._4_4_ = fVar51;
  auVar11._0_4_ = fVar51;
  auVar11._8_4_ = fVar51;
  auVar11._12_4_ = fVar51;
  fVar51 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar43._4_4_ = fVar51;
  auVar43._0_4_ = fVar51;
  auVar43._8_4_ = fVar51;
  auVar43._12_4_ = fVar51;
  fVar51 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar54._4_4_ = fVar51;
  auVar54._0_4_ = fVar51;
  auVar54._8_4_ = fVar51;
  auVar54._12_4_ = fVar51;
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar11,auVar43);
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar54);
  Transform::operator()((Vector3fi *)&local_a8,this->objectFromRender,&local_78);
  auVar11 = (undefined1  [16])
            local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_;
  auVar81._8_8_ = 0;
  auVar81._0_4_ =
       local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar81._4_4_ =
       local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = auVar11._0_8_
  ;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar81,auVar23);
  auVar19 = vshufps_avx(auVar10,auVar10,0xf5);
  auVar23 = vmaxss_avx(auVar10,auVar19);
  fVar51 = auVar23._0_4_;
  if ((0.0 < auVar11._8_4_) || (auVar23 = vmovshdup_avx(auVar81), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar19,auVar10);
    fVar51 = fVar51 * fVar51;
    fVar42 = auVar23._0_4_ * auVar23._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar42),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar42 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar42);
    auVar23 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar51 < INFINITY) {
      auVar72._0_12_ = ZEXT812(0);
      auVar72._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar72,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      auVar23 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
    }
    auVar10 = ZEXT416((int)fVar42 + -1 + (uint)(fVar42 <= 0.0) * 2);
    auVar19 = vminss_avx(auVar23,auVar10);
    auVar23 = vmaxss_avx(auVar23,auVar10);
    auVar23 = vinsertps_avx(auVar19,auVar23,0x10);
    IVar15 = auVar23._0_8_;
  }
  else {
    uVar8 = 0x7f800000;
    fVar51 = fVar51 * fVar51;
    if (fVar51 < INFINITY) {
      auVar55._0_12_ = ZEXT812(0);
      auVar55._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar55,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      uVar8 = (-(uint)(fVar51 < 0.0) | 1) + (int)fVar51;
    }
    auVar56._4_4_ = uVar8;
    auVar56._0_4_ = uVar8;
    auVar56._8_4_ = uVar8;
    auVar56._12_4_ = uVar8;
    auVar23 = vblendps_avx(auVar56,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar8),auVar23,1);
    IVar15.high = (Float)(((byte)(uVar1 >> 1) & 1) * uVar8);
    IVar15.low = (Float)(((byte)uVar1 & 1) * uVar8);
  }
  IVar16 = local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ = auVar11;
  IVar15 = FMA(IVar16,IVar16,IVar15);
  local_f8._8_8_ = extraout_XMM0_Qb;
  local_f8._0_4_ = IVar15.low;
  local_f8._4_4_ = IVar15.high;
  IVar16.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
  IVar16.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
  IVar15 = Interval::operator*((Interval *)&local_a8,IVar16);
  i.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  i.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  IVar16 = Interval::operator*(&local_a8.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i);
  local_d8 = IVar15.low;
  fStack_d4 = IVar15.high;
  fStack_d0 = (float)extraout_XMM0_Qb_00;
  fStack_cc = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  auVar23 = SUB6416(ZEXT464(0xff800000),0);
  fVar51 = local_d8 + IVar16.low;
  if (-INFINITY < fVar51) {
    auVar44._0_12_ = ZEXT812(0);
    auVar44._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar44,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar23 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  auVar11 = SUB6416(ZEXT464(0x7f800000),0);
  auVar17._0_4_ = local_d8 + IVar16.low;
  auVar17._4_4_ = fStack_d4 + IVar16.high;
  auVar17._8_4_ = fStack_d0 + (float)extraout_XMM0_Qb_01;
  auVar17._12_4_ = fStack_cc + (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  auVar19 = vmovshdup_avx(auVar17);
  if (auVar19._0_4_ < INFINITY) {
    auVar57._0_12_ = ZEXT812(0);
    auVar57._12_4_ = 0;
    uVar2 = vcmpss_avx512f(auVar19,auVar57,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar19._0_4_);
    auVar11 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar19 = vminss_avx(auVar11,auVar23);
  auVar23 = vmaxss_avx(auVar11,auVar23);
  auVar58._8_4_ = 0x40000000;
  auVar58._0_8_ = 0x4000000040000000;
  auVar58._12_4_ = 0x40000000;
  auVar23 = vinsertps_avx(auVar19,auVar23,0x10);
  IVar15 = (Interval)vmovlps_avx(auVar58);
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = IVar15;
  auVar26._0_8_ = Interval::operator*((Interval *)&local_78,auVar23._0_8_);
  auVar26._8_56_ = extraout_var_05;
  auVar82._4_4_ =
       local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar82._0_4_ =
       local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar82._8_8_ = 0;
  local_90 = (Interval)vmovlps_avx(auVar26._0_16_);
  a.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  a.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar82,auVar4);
  auVar19 = vshufps_avx(auVar11,auVar11,0xf5);
  auVar23 = vmaxss_avx(auVar11,auVar19);
  fVar51 = auVar23._0_4_;
  if ((0.0 < local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low)
     || (auVar23 = vmovshdup_avx(auVar82), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar19,auVar11);
    fVar51 = fVar51 * fVar51;
    fVar42 = auVar23._0_4_ * auVar23._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar42),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar42 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar42);
    auVar23 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar51 < INFINITY) {
      auVar73._0_12_ = ZEXT812(0);
      auVar73._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar73,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      auVar23 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
    }
    auVar11 = ZEXT416((int)fVar42 + -1 + (uint)(fVar42 <= 0.0) * 2);
    auVar19 = vminss_avx(auVar23,auVar11);
    auVar23 = vmaxss_avx(auVar23,auVar11);
    auVar23 = vinsertps_avx(auVar19,auVar23,0x10);
    c_00 = auVar23._0_8_;
  }
  else {
    uVar8 = 0x7f800000;
    fVar51 = fVar51 * fVar51;
    if (fVar51 < INFINITY) {
      auVar59._0_12_ = ZEXT812(0);
      auVar59._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar59,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      uVar8 = (-(uint)(fVar51 < 0.0) | 1) + (int)fVar51;
    }
    auVar60._4_4_ = uVar8;
    auVar60._0_4_ = uVar8;
    auVar60._8_4_ = uVar8;
    auVar60._12_4_ = uVar8;
    auVar23 = vblendps_avx(auVar60,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar8),auVar23,1);
    c_00.high = (Float)(((byte)(uVar1 >> 1) & 1) * uVar8);
    c_00.low = (Float)(((byte)uVar1 & 1) * uVar8);
  }
  auVar23 = vmaxss_avx(local_f8,ZEXT416(0));
  auVar10 = vmovshdup_avx(local_f8);
  auVar27._0_8_ = FMA(a,a,c_00);
  auVar27._8_56_ = extraout_var_06;
  fVar51 = this->radius;
  auVar43 = vmovshdup_avx(auVar27._0_16_);
  auVar19 = vmaxss_avx(auVar27._0_16_,ZEXT816(0) << 0x40);
  auVar11 = vminss_avx(auVar43,auVar19);
  fVar42 = fVar51 * fVar51;
  auVar53 = ZEXT416((uint)fVar42);
  if ((fVar51 != 0.0) || (NAN(fVar51))) {
    uVar2 = vcmpss_avx512f(auVar53,ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar42);
    auVar54 = SUB6416(ZEXT464(0x7f800000),0);
    if (fVar42 < INFINITY) {
      auVar83._0_12_ = ZEXT812(0);
      auVar83._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar53,auVar83,0);
      fVar42 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar42);
      auVar54 = ZEXT416((-(uint)(fVar42 < 0.0) | 1) + (int)fVar42);
    }
    auVar53 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
    auVar81 = vminss_avx(auVar54,auVar53);
    auVar53 = vmaxss_avx(auVar54,auVar53);
    auVar12 = vinsertps_avx(auVar81,auVar53,0x10);
  }
  else {
    uVar8 = 0x7f800000;
    if (fVar42 < INFINITY) {
      auVar77._0_12_ = ZEXT812(0);
      auVar77._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar53,auVar77,0);
      uVar8 = (uint)!(bool)((byte)uVar2 & 1) * (int)fVar42 + 1;
    }
    auVar78._4_4_ = uVar8;
    auVar78._0_4_ = uVar8;
    auVar78._8_4_ = uVar8;
    auVar78._12_4_ = uVar8;
    auVar5._12_4_ = 0;
    auVar5._0_12_ = ZEXT812(0);
    auVar53 = vblendps_avx(auVar78,auVar5 << 0x20,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar8),auVar53,1);
    auVar12._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar8;
    auVar12._0_4_ = ((byte)uVar1 & 1) * uVar8;
    auVar12._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar8;
    auVar12._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar8;
  }
  auVar19 = vmaxss_avx(auVar43,auVar19);
  auVar43 = vmovshdup_avx(auVar12);
  fVar51 = auVar11._0_4_ - auVar43._0_4_;
  auVar11 = vminss_avx(auVar10,ZEXT416(auVar23._0_4_));
  auVar23 = vmaxss_avx(auVar10,ZEXT416(auVar23._0_4_));
  auVar10 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar51) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),ZEXT816(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar10 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  auVar43 = SUB6416(ZEXT464(0x7f800000),0);
  fVar51 = auVar19._0_4_ - auVar12._0_4_;
  local_88 = vinsertps_avx(auVar11,auVar23,0x10);
  if (fVar51 < INFINITY) {
    auVar61._0_12_ = ZEXT812(0);
    auVar61._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar61,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
    auVar43 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar19 = vminss_avx(auVar43,auVar10);
  auVar23 = vmaxss_avx(auVar43,auVar10);
  auVar23 = vinsertps_avx(auVar19,auVar23,0x10);
  auVar62._8_4_ = 0x40000000;
  auVar62._0_8_ = 0x4000000040000000;
  auVar62._12_4_ = 0x40000000;
  local_50 = (Interval)vmovlps_avx(auVar23);
  uVar2 = vmovlps_avx(auVar62);
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
       (Float)(int)uVar2;
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
       (Float)(int)((ulong)uVar2 >> 0x20);
  IVar15 = Interval::operator*((Interval *)&local_78,local_88._0_8_);
  auVar28._0_8_ = Interval::operator/(&local_90,IVar15);
  auVar28._8_56_ = extraout_var_07;
  local_58 = (Interval)vmovlps_avx(auVar28._0_16_);
  auVar29._0_8_ =
       Interval::operator*(&local_58,
                           local_a8.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  auVar29._8_56_ = extraout_var_08;
  auVar23 = vmovshdup_avx(auVar29._0_16_);
  fVar51 = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low -
           auVar23._0_4_;
  uVar8 = 0xff800000;
  if (-INFINITY < fVar51) {
    auVar63._0_12_ = ZEXT812(0);
    auVar63._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar63,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    uVar8 = (int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2;
  }
  fVar51 = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high -
           auVar29._0_4_;
  uVar9 = 0x7f800000;
  if (fVar51 < INFINITY) {
    auVar45._0_12_ = ZEXT812(0);
    auVar45._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar45,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
    uVar9 = (-(uint)(fVar51 < 0.0) | 1) + (int)fVar51;
  }
  auVar30._0_8_ =
       Interval::operator*(&local_58,
                           local_a8.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  auVar30._8_56_ = extraout_var_09;
  auVar23 = vmovshdup_avx(auVar30._0_16_);
  fVar51 = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low -
           auVar23._0_4_;
  auVar23 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < fVar51) {
    auVar46._0_12_ = ZEXT812(0);
    auVar46._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar46,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar23 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  auVar11 = vminss_avx(ZEXT416(uVar9),ZEXT416(uVar8));
  auVar19 = vmaxss_avx(ZEXT416(uVar9),ZEXT416(uVar8));
  fVar51 = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
           auVar30._0_4_;
  auVar10 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar51 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),ZEXT816(0),0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
    auVar10 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar54 = vminss_avx(auVar10,auVar23);
  auVar43 = vmaxss_avx(auVar10,auVar23);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx(auVar11,auVar74);
  auVar10 = vandps_avx(auVar19,auVar74);
  auVar53 = vmaxss_avx(auVar23,auVar10);
  fVar51 = auVar53._0_4_;
  if ((0.0 < auVar11._0_4_) || (auVar19._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar10,auVar23);
    auVar19 = SUB6416(ZEXT464(0x7f800000),0);
    fVar51 = fVar51 * fVar51;
    fVar42 = auVar23._0_4_ * auVar23._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar42),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar42 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar42);
    if (fVar51 < INFINITY) {
      auVar84._0_12_ = ZEXT812(0);
      auVar84._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar84,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      auVar19 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
    }
    auVar23 = ZEXT416((int)fVar42 + -1 + (uint)(fVar42 <= 0.0) * 2);
    auVar11 = vminss_avx(auVar19,auVar23);
    auVar23 = vmaxss_avx(auVar19,auVar23);
    auVar13 = vinsertps_avx(auVar11,auVar23,0x10);
  }
  else {
    uVar8 = 0x7f800000;
    fVar51 = fVar51 * fVar51;
    if (fVar51 < INFINITY) {
      auVar79._0_12_ = ZEXT812(0);
      auVar79._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar79,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      uVar8 = (-(uint)(fVar51 < 0.0) | 1) + (int)fVar51;
    }
    auVar80._4_4_ = uVar8;
    auVar80._0_4_ = uVar8;
    auVar80._8_4_ = uVar8;
    auVar80._12_4_ = uVar8;
    auVar23 = vblendps_avx(auVar80,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar8),auVar23,1);
    auVar13._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar8;
    auVar13._0_4_ = ((byte)uVar1 & 1) * uVar8;
    auVar13._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar8;
    auVar13._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar8;
  }
  auVar23 = vandps_avx(auVar54,auVar74);
  auVar19 = vandps_avx(auVar43,auVar74);
  auVar11 = vmaxss_avx(auVar23,auVar19);
  fVar51 = auVar11._0_4_;
  if ((0.0 < auVar54._0_4_) || (auVar43._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar19,auVar23);
    fVar51 = fVar51 * fVar51;
    auVar19 = SUB6416(ZEXT464(0x7f800000),0);
    fVar42 = auVar23._0_4_ * auVar23._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar42),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar42 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar42);
    if (fVar51 < INFINITY) {
      auVar75._0_12_ = ZEXT812(0);
      auVar75._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar75,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      auVar19 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
    }
    auVar23 = ZEXT416((int)fVar42 + -1 + (uint)(fVar42 <= 0.0) * 2);
    auVar11 = vminss_avx(auVar19,auVar23);
    auVar23 = vmaxss_avx(auVar19,auVar23);
    auVar14 = vinsertps_avx(auVar11,auVar23,0x10);
  }
  else {
    uVar8 = 0x7f800000;
    fVar51 = fVar51 * fVar51;
    if (fVar51 < INFINITY) {
      auVar64._0_12_ = ZEXT812(0);
      auVar64._12_4_ = 0;
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar64,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
      uVar8 = (-(uint)(fVar51 < 0.0) | 1) + (int)fVar51;
    }
    auVar65._4_4_ = uVar8;
    auVar65._0_4_ = uVar8;
    auVar65._8_4_ = uVar8;
    auVar65._12_4_ = uVar8;
    auVar23 = vblendps_avx(auVar65,ZEXT816(0),0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416(uVar8),auVar23,1);
    auVar14._4_4_ = ((byte)(uVar1 >> 1) & 1) * uVar8;
    auVar14._0_4_ = ((byte)uVar1 & 1) * uVar8;
    auVar14._8_4_ = ((byte)(uVar1 >> 2) & 1) * uVar8;
    auVar14._12_4_ = ((byte)(uVar1 >> 3) & 1) * uVar8;
  }
  auVar23 = SUB6416(ZEXT464(0xff800000),0);
  fVar51 = auVar13._0_4_ + auVar14._0_4_;
  if (-INFINITY < fVar51) {
    auVar76._0_12_ = ZEXT812(0);
    auVar76._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar76,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar23 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  auVar11 = SUB6416(ZEXT464(0x7f800000),0);
  auVar18._0_4_ = auVar13._0_4_ + auVar14._0_4_;
  auVar18._4_4_ = auVar13._4_4_ + auVar14._4_4_;
  auVar18._8_4_ = auVar13._8_4_ + auVar14._8_4_;
  auVar18._12_4_ = auVar13._12_4_ + auVar14._12_4_;
  auVar19 = vmovshdup_avx(auVar18);
  if (auVar19._0_4_ < INFINITY) {
    uVar2 = vcmpss_avx512f(auVar19,ZEXT816(0) << 0x40,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar19._0_4_);
    auVar11 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar19 = vminss_avx(auVar11,auVar23);
  if (auVar19._0_4_ < 0.0) {
    auVar31._0_4_ = sqrtf(auVar19._0_4_);
    auVar31._4_60_ = extraout_var;
    auVar11 = ZEXT416(auVar11._0_4_);
    auVar23 = ZEXT416(auVar23._0_4_);
    auVar19 = auVar31._0_16_;
  }
  else {
    auVar19 = vsqrtss_avx(auVar19,auVar19);
  }
  auVar23 = vmaxss_avx(auVar11,auVar23);
  auVar11 = SUB6416(ZEXT464(0xff800000),0);
  if (-INFINITY < auVar19._0_4_) {
    uVar2 = vcmpss_avx512f(auVar19,ZEXT416(0) << 0x20,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar19._0_4_);
    auVar11 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  if (auVar23._0_4_ < 0.0) {
    auVar32._0_4_ = sqrtf(auVar23._0_4_);
    auVar32._4_60_ = extraout_var_00;
    auVar23 = auVar32._0_16_;
    auVar11 = ZEXT416(auVar11._0_4_);
  }
  else {
    auVar23 = vsqrtss_avx(auVar23,auVar23);
  }
  auVar19 = SUB6416(ZEXT464(0x7f800000),0);
  if (auVar23._0_4_ < INFINITY) {
    auVar47._0_12_ = ZEXT812(0);
    auVar47._12_4_ = 0;
    uVar2 = vcmpss_avx512f(auVar23,auVar47,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar23._0_4_);
    auVar19 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar23 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
  auVar11 = vminss_avx(auVar19,auVar23);
  auVar23 = vmaxss_avx(auVar19,auVar23);
  auVar20._8_4_ = 0x40800000;
  auVar20._0_8_ = 0x4080000040800000;
  auVar20._12_4_ = 0x40800000;
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar20);
  auVar33._0_8_ = Interval::operator*((Interval *)&local_78,(Interval)local_88._0_8_);
  auVar33._8_56_ = extraout_var_10;
  local_60 = (Interval)vmovlps_avx(auVar33._0_16_);
  auVar19 = SUB6416(ZEXT464(0xff800000),0);
  fVar51 = this->radius + auVar11._0_4_;
  if (-INFINITY < fVar51) {
    auVar21._0_12_ = ZEXT812(0);
    auVar21._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar21,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar19 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  fVar51 = this->radius + auVar23._0_4_;
  auVar10 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar51 < INFINITY) {
    auVar66._0_12_ = ZEXT812(0);
    auVar66._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar66,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
    auVar10 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar43 = vminss_avx(auVar10,auVar19);
  auVar19 = vmaxss_avx(auVar10,auVar19);
  auVar19 = vinsertps_avx(auVar43,auVar19,0x10);
  auVar34._0_8_ = Interval::operator*(&local_60,auVar19._0_8_);
  auVar34._8_56_ = extraout_var_11;
  uVar2 = vmovlps_avx(auVar34._0_16_);
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
       (Float)(int)uVar2;
  local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
       (Float)(int)((ulong)uVar2 >> 0x20);
  auVar19 = SUB6416(ZEXT464(0xff800000),0);
  fVar51 = this->radius - auVar23._0_4_;
  if (-INFINITY < fVar51) {
    auVar22._0_12_ = ZEXT812(0);
    auVar22._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar22,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
    auVar19 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
  }
  fVar51 = this->radius - auVar11._0_4_;
  auVar23 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar51 < INFINITY) {
    auVar67._0_12_ = ZEXT812(0);
    auVar67._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar67,0);
    fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
    auVar23 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
  }
  auVar11 = vminss_avx(auVar23,auVar19);
  auVar23 = vmaxss_avx(auVar23,auVar19);
  auVar23 = vinsertps_avx(auVar11,auVar23,0x10);
  auVar35._0_8_ = Interval::operator*((Interval *)&local_78,auVar23._0_8_);
  auVar35._8_56_ = extraout_var_12;
  auVar23 = auVar35._0_16_;
  fVar51 = auVar35._0_4_;
  if (0.0 <= fVar51) {
    if (fVar51 < 0.0) {
      auVar36._0_4_ = sqrtf(fVar51);
      auVar36._4_60_ = extraout_var_01;
      auVar19 = auVar36._0_16_;
    }
    else {
      auVar19 = vsqrtss_avx(auVar23,auVar23);
    }
    auVar11 = SUB6416(ZEXT464(0xff800000),0);
    if (-INFINITY < auVar19._0_4_) {
      uVar2 = vcmpss_avx512f(auVar19,ZEXT816(0) << 0x40,0);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar19._0_4_);
      auVar11 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
    }
    auVar23 = vmovshdup_avx(auVar23);
    if (auVar23._0_4_ < 0.0) {
      auVar37._0_4_ = sqrtf(auVar23._0_4_);
      auVar37._4_60_ = extraout_var_02;
      auVar23 = auVar37._0_16_;
      auVar11 = ZEXT416(auVar11._0_4_);
    }
    else {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
    }
    auVar19 = SUB6416(ZEXT464(0x7f800000),0);
    if (auVar23._0_4_ < INFINITY) {
      uVar2 = vcmpss_avx512f(auVar23,ZEXT816(0) << 0x40,0);
      fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar23._0_4_);
      auVar19 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
    }
    auVar23 = vmaxss_avx(auVar11,ZEXT816(0) << 0x40);
    auVar11 = vminss_avx(auVar19,auVar23);
    auVar23 = vmaxss_avx(auVar19,auVar23);
    if (0.0 <= (local_90.low + local_90.high) * 0.5) {
      fVar51 = auVar11._0_4_ + local_90.low;
      auVar19 = SUB6416(ZEXT464(0xff800000),0);
      if (-INFINITY < fVar51) {
        auVar49._0_12_ = ZEXT812(0);
        auVar49._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar49,0);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
        auVar19 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
      }
      fVar51 = auVar23._0_4_ + local_90.high;
      auVar23 = SUB6416(ZEXT464(0x7f800000),0);
      if (fVar51 < INFINITY) {
        auVar69._0_12_ = ZEXT812(0);
        auVar69._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar69,0);
        fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
        auVar23 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
      }
      auVar11 = vminss_avx(auVar23,auVar19);
      auVar23 = vmaxss_avx(auVar23,auVar19);
    }
    else {
      fVar51 = local_90.low - auVar23._0_4_;
      auVar23 = SUB6416(ZEXT464(0xff800000),0);
      if (-INFINITY < fVar51) {
        auVar68._0_12_ = ZEXT812(0);
        auVar68._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar68,0);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar51 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar51);
        auVar23 = ZEXT416((int)fVar51 + -1 + (uint)(fVar51 <= 0.0) * 2);
      }
      fVar51 = local_90.high - auVar11._0_4_;
      auVar19 = SUB6416(ZEXT464(0x7f800000),0);
      if (fVar51 < INFINITY) {
        auVar48._0_12_ = ZEXT812(0);
        auVar48._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar51),auVar48,0);
        fVar51 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar51);
        auVar19 = ZEXT416((-(uint)(fVar51 < 0.0) | 1) + (int)fVar51);
      }
      auVar11 = vminss_avx(auVar19,auVar23);
      auVar23 = vmaxss_avx(auVar19,auVar23);
    }
    auVar70._8_4_ = 0xbf000000;
    auVar70._0_8_ = 0xbf000000bf000000;
    auVar70._12_4_ = 0xbf000000;
    auVar23 = vinsertps_avx(auVar11,auVar23,0x10);
    local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x =
         (Interval)vmovlps_avx(auVar70);
    auVar38._0_8_ = Interval::operator*((Interval *)&local_78,auVar23._0_8_);
    auVar38._8_56_ = extraout_var_13;
    uVar2 = vmovlps_avx(auVar38._0_16_);
    local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
         (Float)(int)uVar2;
    local_78.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
         (Float)(int)((ulong)uVar2 >> 0x20);
    IVar15 = Interval::operator/((Interval *)&local_78,(Interval)local_88._0_8_);
    local_f8._8_8_ = extraout_XMM0_Qb_02;
    local_f8._0_4_ = IVar15.low;
    local_f8._4_4_ = IVar15.high;
    auVar39._0_8_ =
         Interval::operator/(&local_50,
                             local_78.super_Vector3<pbrt::Interval>.
                             super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x);
    auVar39._8_56_ = extraout_var_14;
    auVar23 = auVar39._0_16_;
    local_48 = local_f8;
    if (IVar15.low <= auVar39._0_4_) {
      local_48 = auVar23;
      auVar23 = local_f8;
    }
    local_28 = vmovshdup_avx(auVar23);
    if (((tMax < local_28._0_4_) || (local_48._0_4_ <= 0.0)) ||
       ((auVar23._0_4_ <= 0.0 &&
        (local_28 = vmovshdup_avx(local_48), auVar23 = local_48, tMax < local_28._0_4_))))
    goto LAB_002e7f31;
    fVar52 = auVar23._0_4_;
    auVar6._4_4_ = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.high;
    auVar6._0_4_ = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.low;
    auVar6._8_4_ = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   y.low;
    auVar6._12_4_ =
         local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar23 = vinsertps_avx(auVar6,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    fVar42 = (fVar52 + local_28._0_4_) * 0.5;
    auVar19 = vinsertps_avx((undefined1  [16])
                            local_a8.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_a8.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    local_88 = ZEXT416((uint)fVar42);
    fVar51 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
             + local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               high) * 0.5 +
             fVar42 * (local_a8.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      local_a8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar24._0_4_ =
         (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar23._0_4_) * 0.5 +
         fVar42 * (local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.high + auVar19._0_4_) * 0.5;
    auVar24._4_4_ =
         (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar23._4_4_) * 0.5 +
         fVar42 * (local_a8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   y.low + auVar19._4_4_) * 0.5;
    auVar24._8_4_ = (auVar23._8_4_ + 0.0) * 0.5 + fVar42 * (auVar19._8_4_ + 0.0) * 0.5;
    auVar24._12_4_ = (auVar23._12_4_ + 0.0) * 0.5 + fVar42 * (auVar19._12_4_ + 0.0) * 0.5;
    auVar71._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar71._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar71._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar71._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar23 = vmovshdup_avx(auVar71);
    auVar23 = vfmadd231ss_fma(auVar23,auVar24,auVar24);
    auVar23 = vsqrtss_avx(auVar23,auVar23);
    fVar42 = this->radius / auVar23._0_4_;
    local_38._0_4_ = auVar24._0_4_ * fVar42;
    local_38._4_4_ = auVar24._4_4_ * fVar42;
    local_38._8_4_ = auVar24._8_4_ * fVar42;
    local_38._12_4_ = auVar24._12_4_ * fVar42;
    auVar23 = vmovshdup_avx(local_38);
    auVar40._0_4_ = atan2f(auVar23._0_4_,local_38._0_4_);
    auVar40._4_60_ = extraout_var_03;
    if ((this->zMin <= fVar51) && (fVar51 <= this->zMax)) {
      uVar2 = vcmpss_avx512f(auVar40._0_16_,ZEXT816(0) << 0x40,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar42 = (float)((uint)bVar3 * (int)(auVar40._0_4_ + 6.2831855) +
                      (uint)!bVar3 * (int)auVar40._0_4_);
      if (fVar42 <= this->phiMax) goto LAB_002e7ed6;
    }
    fVar42 = local_48._0_4_;
    auVar23 = vmovshdup_avx(local_48);
    fVar51 = auVar23._0_4_;
    if ((fVar52 == fVar42) && (!NAN(fVar52) && !NAN(fVar42))) {
      if (((float)local_28._0_4_ == fVar51) && (!NAN((float)local_28._0_4_) && !NAN(fVar51)))
      goto LAB_002e7f31;
    }
    if (fVar51 <= tMax) {
      auVar7._4_4_ = local_c8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar7._0_4_ = local_c8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar7._8_4_ = local_c8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar7._12_4_ =
           local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar23 = vinsertps_avx(auVar7,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      fVar42 = (fVar42 + fVar51) * 0.5;
      auVar19 = vinsertps_avx((undefined1  [16])
                              local_a8.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                              ZEXT416((uint)local_a8.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
      ;
      local_88 = ZEXT416((uint)fVar42);
      fVar51 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + local_c8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
               fVar42 * (local_a8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                        local_a8.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar25._0_4_ =
           (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar23._0_4_) * 0.5 +
           fVar42 * (local_a8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high + auVar19._0_4_) * 0.5;
      auVar25._4_4_ =
           (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
           auVar23._4_4_) * 0.5 +
           fVar42 * (local_a8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low + auVar19._4_4_) * 0.5;
      auVar25._8_4_ = (auVar23._8_4_ + 0.0) * 0.5 + fVar42 * (auVar19._8_4_ + 0.0) * 0.5;
      auVar25._12_4_ = (auVar23._12_4_ + 0.0) * 0.5 + fVar42 * (auVar19._12_4_ + 0.0) * 0.5;
      auVar50._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar50._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar50._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar50._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar23 = vmovshdup_avx(auVar50);
      auVar23 = vfmadd231ss_fma(auVar23,auVar25,auVar25);
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar42 = this->radius / auVar23._0_4_;
      local_38._0_4_ = auVar25._0_4_ * fVar42;
      local_38._4_4_ = auVar25._4_4_ * fVar42;
      local_38._8_4_ = auVar25._8_4_ * fVar42;
      local_38._12_4_ = auVar25._12_4_ * fVar42;
      auVar23 = vmovshdup_avx(local_38);
      auVar41._0_4_ = atan2f(auVar23._0_4_,local_38._0_4_);
      auVar41._4_60_ = extraout_var_04;
      if ((this->zMin <= fVar51) && (fVar51 <= this->zMax)) {
        uVar2 = vcmpss_avx512f(auVar41._0_16_,ZEXT816(0) << 0x40,1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar42 = (float)((uint)bVar3 * (int)(auVar41._0_4_ + 6.2831855) +
                        (uint)!bVar3 * (int)auVar41._0_4_);
        if (fVar42 <= this->phiMax) {
LAB_002e7ed6:
          __return_storage_ptr__->set = true;
          (__return_storage_ptr__->optionalValue).__align =
               (anon_struct_4_0_00000001_for___align)local_88._0_4_;
          uVar2 = vmovlps_avx(local_38);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar51;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar42;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_002e7f31:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        Interval t0, t1;
        // Compute cylinder quadratic coefficients
        Interval a = SumSquares(di.x, di.y);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y);
        Interval c = SumSquares(oi.x, oi.y) - Sqr(Interval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Interval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        Interval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }